

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O1

aiNode * __thiscall
Assimp::Q3BSPFileImporter::CreateTopology
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,uint materialIdx,
          vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *rArray,
          aiMesh **pMesh)

{
  size_t __n;
  pointer ppsVar1;
  sQ3BSPFace *pQ3BSPFace;
  undefined1 auVar2 [16];
  Q3BSPModel *pModel_00;
  size_t sVar3;
  long lVar4;
  aiMesh *pMesh_00;
  pointer ppsVar5;
  ulong *puVar6;
  aiFace *paVar7;
  aiVector3D *paVar8;
  aiNode *this_00;
  uint *puVar9;
  aiFace *paVar10;
  ulong uVar11;
  pointer ppsVar12;
  uint vertIdx;
  uint faceIdx;
  uint local_58 [2];
  aiMesh **local_50;
  char *local_48;
  Q3BSPModel *local_40;
  Q3BSPFileImporter *local_38;
  
  local_38 = this;
  sVar3 = countData(this,rArray);
  if (sVar3 != 0) {
    ppsVar12 = (rArray->
               super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    ppsVar1 = (rArray->
              super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppsVar12 != ppsVar1) {
      lVar4 = 0;
      ppsVar5 = ppsVar12;
      do {
        lVar4 = lVar4 + (ulong)(0 < (*ppsVar5)->iNumOfFaceVerts);
        ppsVar5 = ppsVar5 + 1;
      } while (ppsVar5 != ppsVar1);
      uVar11 = 0;
      if (lVar4 == 0) {
        return (aiNode *)0x0;
      }
      local_50 = pMesh;
      local_40 = pModel;
      pMesh_00 = (aiMesh *)operator_new(0x520);
      pMesh_00->mPrimitiveTypes = 0;
      pMesh_00->mNumVertices = 0;
      pMesh_00->mNumFaces = 0;
      local_48 = (pMesh_00->mName).data + 1;
      memset(&pMesh_00->mVertices,0,0xcc);
      pMesh_00->mBones = (aiBone **)0x0;
      pMesh_00->mMaterialIndex = 0;
      (pMesh_00->mName).length = 0;
      (pMesh_00->mName).data[0] = '\0';
      memset(local_48,0x1b,0x3ff);
      pMesh_00->mNumAnimMeshes = 0;
      pMesh_00->mAnimMeshes = (aiAnimMesh **)0x0;
      pMesh_00->mMethod = 0;
      (pMesh_00->mAABB).mMin.x = 0.0;
      (pMesh_00->mAABB).mMin.y = 0.0;
      (pMesh_00->mAABB).mMin.z = 0.0;
      (pMesh_00->mAABB).mMax.x = 0.0;
      (pMesh_00->mAABB).mMax.y = 0.0;
      (pMesh_00->mAABB).mMax.z = 0.0;
      pMesh_00->mTextureCoords[0] = (aiVector3D *)0x0;
      pMesh_00->mTextureCoords[1] = (aiVector3D *)0x0;
      pMesh_00->mTextureCoords[2] = (aiVector3D *)0x0;
      pMesh_00->mTextureCoords[3] = (aiVector3D *)0x0;
      pMesh_00->mTextureCoords[4] = (aiVector3D *)0x0;
      pMesh_00->mTextureCoords[5] = (aiVector3D *)0x0;
      pMesh_00->mTextureCoords[6] = (aiVector3D *)0x0;
      pMesh_00->mTextureCoords[7] = (aiVector3D *)0x0;
      pMesh_00->mNumUVComponents[0] = 0;
      pMesh_00->mNumUVComponents[1] = 0;
      pMesh_00->mNumUVComponents[2] = 0;
      pMesh_00->mNumUVComponents[3] = 0;
      pMesh_00->mNumUVComponents[4] = 0;
      pMesh_00->mNumUVComponents[5] = 0;
      pMesh_00->mNumUVComponents[6] = 0;
      pMesh_00->mNumUVComponents[7] = 0;
      pMesh_00->mColors[0] = (aiColor4D *)0x0;
      pMesh_00->mColors[1] = (aiColor4D *)0x0;
      pMesh_00->mColors[2] = (aiColor4D *)0x0;
      pMesh_00->mColors[3] = (aiColor4D *)0x0;
      pMesh_00->mColors[4] = (aiColor4D *)0x0;
      pMesh_00->mColors[5] = (aiColor4D *)0x0;
      pMesh_00->mColors[6] = (aiColor4D *)0x0;
      pMesh_00->mColors[7] = (aiColor4D *)0x0;
      if (ppsVar12 != ppsVar1) {
        uVar11 = 0;
        ppsVar5 = ppsVar12;
        do {
          if (*ppsVar5 != (sQ3BSPFace *)0x0) {
            uVar11 = uVar11 + (long)((*ppsVar5)->iNumOfFaceVerts / 3);
          }
          ppsVar5 = ppsVar5 + 1;
        } while (ppsVar5 != ppsVar1);
      }
      pMesh_00->mPrimitiveTypes = 4;
      puVar6 = (ulong *)operator_new__(-(ulong)(uVar11 >> 0x3c != 0) | uVar11 * 0x10 | 8);
      *puVar6 = uVar11;
      paVar7 = (aiFace *)(puVar6 + 1);
      if (uVar11 != 0) {
        paVar10 = paVar7;
        do {
          paVar10->mNumIndices = 0;
          paVar10->mIndices = (uint *)0x0;
          paVar10 = paVar10 + 1;
        } while (paVar10 != paVar7 + uVar11);
      }
      pMesh_00->mFaces = paVar7;
      pMesh_00->mNumFaces = (uint)uVar11;
      pMesh_00->mNumVertices = (uint)sVar3;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = sVar3;
      uVar11 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
        uVar11 = SUB168(auVar2 * ZEXT816(0xc),0);
      }
      paVar8 = (aiVector3D *)operator_new__(uVar11);
      __n = ((sVar3 * 0xc - 0xc) / 0xc) * 0xc + 0xc;
      memset(paVar8,0,__n);
      pMesh_00->mVertices = paVar8;
      paVar8 = (aiVector3D *)operator_new__(uVar11);
      memset(paVar8,0,__n);
      pMesh_00->mNormals = paVar8;
      paVar8 = (aiVector3D *)operator_new__(uVar11);
      memset(paVar8,0,__n);
      pMesh_00->mTextureCoords[0] = paVar8;
      paVar8 = (aiVector3D *)operator_new__(uVar11);
      memset(paVar8,0,__n);
      pModel_00 = local_40;
      pMesh_00->mTextureCoords[1] = paVar8;
      pMesh_00->mMaterialIndex = materialIdx;
      local_58[1] = 0;
      local_58[0] = 0;
      pMesh_00->mNumUVComponents[0] = 2;
      pMesh_00->mNumUVComponents[1] = 2;
      if (ppsVar12 !=
          (rArray->
          super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pQ3BSPFace = *ppsVar12;
          if (pQ3BSPFace == (sQ3BSPFace *)0x0) {
            __assert_fail("__null != pQ3BSPFace",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                          ,0x160,
                          "aiNode *Assimp::Q3BSPFileImporter::CreateTopology(const Q3BSP::Q3BSPModel *, unsigned int, std::vector<sQ3BSPFace *> &, aiMesh **)"
                         );
          }
          if ((0 < pQ3BSPFace->iNumOfFaceVerts) && ((pQ3BSPFace->iType | 2U) == 3)) {
            createTriangleTopology(local_38,pModel_00,pQ3BSPFace,pMesh_00,local_58 + 1,local_58);
          }
          ppsVar12 = ppsVar12 + 1;
        } while (ppsVar12 !=
                 (rArray->
                 super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      }
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      this_00->mNumMeshes = 1;
      puVar9 = (uint *)operator_new__(4);
      this_00->mMeshes = puVar9;
      *local_50 = pMesh_00;
      return this_00;
    }
  }
  return (aiNode *)0x0;
}

Assistant:

aiNode *Q3BSPFileImporter::CreateTopology( const Q3BSP::Q3BSPModel *pModel, unsigned int materialIdx,
        std::vector<sQ3BSPFace*> &rArray, aiMesh **pMesh ) {
    size_t numVerts = countData( rArray );
    if ( 0 == numVerts ) {
        return nullptr;
    }

    size_t numFaces = countFaces( rArray );
    if ( 0 == numFaces ) {
        return nullptr;
    }

    aiMesh *mesh = new aiMesh;
    size_t numTriangles = countTriangles( rArray );
    mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

    mesh->mFaces = new aiFace[ numTriangles ];
    mesh->mNumFaces = static_cast<unsigned int>(numTriangles);

    mesh->mNumVertices = static_cast<unsigned int>(numVerts);
    mesh->mVertices = new aiVector3D[ numVerts ];
    mesh->mNormals =  new aiVector3D[ numVerts ];
    mesh->mTextureCoords[ 0 ] = new aiVector3D[ numVerts ];
    mesh->mTextureCoords[ 1 ] = new aiVector3D[ numVerts ];
    mesh->mMaterialIndex = materialIdx;

    unsigned int faceIdx = 0;
    unsigned int vertIdx = 0;
    mesh->mNumUVComponents[ 0 ] = 2;
    mesh->mNumUVComponents[ 1 ] = 2;
    for ( std::vector<sQ3BSPFace*>::const_iterator it = rArray.begin(); it != rArray.end(); ++it ) {
        Q3BSP::sQ3BSPFace *pQ3BSPFace = *it;
        ai_assert( NULL != pQ3BSPFace );
        if ( nullptr == pQ3BSPFace ) {
            continue;
        }

        if ( pQ3BSPFace->iNumOfFaceVerts > 0 ) {
            if ( pQ3BSPFace->iType == Polygon || pQ3BSPFace->iType == TriangleMesh ) {
                createTriangleTopology( pModel, pQ3BSPFace, mesh, faceIdx, vertIdx );
            }
        }
    }

    aiNode *pNode = new aiNode;
    pNode->mNumMeshes = 1;
    pNode->mMeshes = new unsigned int[ 1 ];
    *pMesh = mesh;

    return pNode;
}